

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O0

t_int * sigrsqrt_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  t_sample g;
  anon_union_8_2_947300a7 u;
  t_sample f;
  int n;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  _f = (float *)w[2];
  u.l._4_4_ = (int)w[3];
  out = (t_sample *)w[1];
  while (u.l._4_4_ != 0) {
    fVar1 = *out;
    if (0.0 <= fVar1) {
      fVar2 = rsqrt_exptab[CONCAT44(g,fVar1) >> 0x17 & 0xff] *
              rsqrt_mantissatab[CONCAT44(g,fVar1) >> 0xd & 0x3ff];
      *_f = fVar2 * 1.5 + -(fVar2 * 0.5 * fVar2 * fVar2 * fVar1);
    }
    else {
      *_f = 0.0;
    }
    _f = _f + 1;
    u.l._4_4_ = u.l._4_4_ + -1;
    out = out + 1;
  }
  return w + 4;
}

Assistant:

static t_int *sigrsqrt_perform(t_int *w)
{
    t_sample *in = (t_sample *)w[1], *out = (t_sample *)w[2];
    int n = (int)w[3];
    while (n--)
    {
        t_sample f = *in++;
        union {
          float f;
          long l;
        } u;
        u.f = f;
        if (f < 0) *out++ = 0;
        else
        {
            t_sample g = rsqrt_exptab[(u.l >> 23) & 0xff] *
                rsqrt_mantissatab[(u.l >> 13) & 0x3ff];
            *out++ = 1.5 * g - 0.5 * g * g * g * f;
        }
    }
    return (w + 4);
}